

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

objdef * objnew(mcmcxdef *mctx,int sccnt,ushort propspace,objnum *objnptr,int classflg)

{
  uchar *puVar1;
  undefined2 *in_RCX;
  undefined4 in_R8D;
  int unaff_retaddr;
  mcmon unaff_retaddr_00;
  mcmon *in_stack_00000008;
  mcmon objn;
  objdef *o;
  undefined4 in_stack_00000018;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  puVar1 = mcmalo0((mcmcxdef *)CONCAT44(classflg,in_stack_00000018),o._6_2_,in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr);
  objini((mcmcxdef *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)puVar1 >> 0x20),
         (objnum)((ulong)puVar1 >> 0x10),in_stack_ffffffffffffffd4);
  *in_RCX = (short)((uint)in_stack_ffffffffffffffd4 >> 0x10);
  return puVar1;
}

Assistant:

objdef *objnew(mcmcxdef *mctx, int sccnt, ushort propspace,
               objnum *objnptr, int classflg)
{
    objdef *o;
    mcmon   objn;

    /* allocate cache object */
    o = (objdef *)mcmalo(mctx, (ushort)(OBJDEFSIZ + sccnt * 2 + propspace),
                         &objn);
    
    /* set up object descriptor for the new object */
    objini(mctx, sccnt, (objnum)objn, classflg);

    *objnptr = (objnum)objn;
    return(o);
}